

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O0

void __thiscall cfd::TransactionContext::Verify(TransactionContext *this,OutPoint *outpoint)

{
  undefined1 uVar1;
  bool bVar2;
  uint uVar3;
  uint32_t vout;
  undefined8 uVar4;
  CfdException *this_00;
  OutPoint *in_RSI;
  AbstractTxIn *in_RDI;
  UtxoData *unaff_retaddr;
  OutPoint *in_stack_00000008;
  TransactionContext *in_stack_00000010;
  OutPoint target_outpoint;
  TxIn *txin_ref;
  iterator __end2;
  iterator __begin2;
  vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *__range2;
  UtxoData work_utxo;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxo_list;
  value_type *txin;
  UtxoData utxo;
  undefined7 in_stack_fffffffffffff3b0;
  undefined1 in_stack_fffffffffffff3b7;
  UtxoData *in_stack_fffffffffffff3b8;
  string *in_stack_fffffffffffff3c0;
  function<cfd::core::ByteData256_(const_cfd::TransactionContext_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*)>
  *this_01;
  undefined8 in_stack_fffffffffffff3c8;
  CfdError CVar5;
  OutPoint *outpoint_00;
  CfdException *in_stack_fffffffffffff3d0;
  TransactionContext *in_stack_fffffffffffff3d8;
  allocator *paVar6;
  UtxoData *utxo_00;
  undefined7 in_stack_fffffffffffff420;
  undefined1 in_stack_fffffffffffff427;
  TransactionContext *in_stack_fffffffffffff428;
  Script local_bb8;
  undefined1 local_b7a;
  allocator local_b79;
  string local_b78 [32];
  Txid local_b58;
  OutPoint local_b38;
  AbstractTxIn *local_b10;
  __normal_iterator<cfd::core::TxIn_*,_std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>_>
  local_b08;
  __normal_iterator<cfd::core::TxIn_*,_std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>_>
  local_b00;
  ByteData *local_af8;
  Script local_aa0 [2];
  UtxoData *in_stack_fffffffffffff5d8;
  Script local_5c8;
  function<cfd::core::ByteData256_(const_cfd::TransactionContext_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*)>
  *local_578;
  undefined1 local_56a;
  allocator local_569;
  string local_568 [48];
  UtxoData local_538;
  OutPoint *create_sighash_func;
  AbstractTxIn *txin_00;
  
  utxo_00 = &local_538;
  txin_00 = in_RDI;
  UtxoData::UtxoData((UtxoData *)CONCAT17(in_stack_fffffffffffff427,in_stack_fffffffffffff420));
  uVar1 = IsFindUtxoMap(in_stack_fffffffffffff428,
                        (OutPoint *)CONCAT17(in_stack_fffffffffffff427,in_stack_fffffffffffff420),
                        utxo_00);
  CVar5 = (CfdError)((ulong)in_stack_fffffffffffff3c8 >> 0x20);
  if (!(bool)uVar1) {
    local_56a = 1;
    uVar4 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_568,"Utxo is not found. verify fail.",&local_569);
    core::CfdException::CfdException(in_stack_fffffffffffff3d0,CVar5,in_stack_fffffffffffff3c0);
    local_56a = 0;
    __cxa_throw(uVar4,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  uVar3 = (*in_RDI->_vptr_AbstractTxIn[0xf])(in_RDI,in_RSI);
  local_578 = (function<cfd::core::ByteData256_(const_cfd::TransactionContext_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*)>
               *)std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>::operator[]
                           ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
                            &(in_RDI->txid_).data_,(ulong)uVar3);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)0x53b7ea);
  GetLockingScriptFromUtxoData(in_stack_fffffffffffff5d8);
  core::Script::operator=(&local_538.locking_script,&local_5c8);
  core::Script::~Script((Script *)CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0));
  bVar2 = core::Script::IsTaprootScript(&local_538.locking_script);
  if (bVar2) {
    UtxoData::UtxoData((UtxoData *)CONCAT17(uVar1,in_stack_fffffffffffff420));
    local_af8 = &(in_RDI->txid_).data_;
    local_b00._M_current =
         (TxIn *)std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>::begin
                           ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)local_af8);
    local_b08._M_current =
         (TxIn *)std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>::end
                           ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)local_af8);
    while (bVar2 = __gnu_cxx::operator!=(&local_b00,&local_b08), bVar2) {
      local_b10 = &__gnu_cxx::
                   __normal_iterator<cfd::core::TxIn_*,_std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>_>
                   ::operator*(&local_b00)->super_AbstractTxIn;
      core::AbstractTxIn::GetTxid(&local_b58,local_b10);
      vout = core::AbstractTxIn::GetVout(local_b10);
      core::OutPoint::OutPoint(&local_b38,&local_b58,vout);
      core::Txid::~Txid((Txid *)0x53b914);
      bVar2 = IsFindUtxoMap(in_stack_fffffffffffff428,
                            (OutPoint *)CONCAT17(uVar1,in_stack_fffffffffffff420),utxo_00);
      CVar5 = (CfdError)((ulong)in_stack_fffffffffffff3c8 >> 0x20);
      if (!bVar2) {
        local_b7a = 1;
        this_00 = (CfdException *)__cxa_allocate_exception(0x30);
        paVar6 = &local_b79;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_b78,"Utxo is not found. Verify fail.",paVar6);
        core::CfdException::CfdException(this_00,CVar5,in_stack_fffffffffffff3c0);
        local_b7a = 0;
        __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
      GetLockingScriptFromUtxoData(in_stack_fffffffffffff5d8);
      core::Script::operator=(local_aa0,&local_bb8);
      core::Script::~Script((Script *)CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0))
      ;
      std::vector<cfd::UtxoData,std::allocator<cfd::UtxoData>>::emplace_back<cfd::UtxoData&>
                ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)in_stack_fffffffffffff3c0,
                 in_stack_fffffffffffff3b8);
      core::OutPoint::~OutPoint((OutPoint *)0x53bb19);
      __gnu_cxx::
      __normal_iterator<cfd::core::TxIn_*,_std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>_>
      ::operator++(&local_b00);
    }
    UtxoData::~UtxoData((UtxoData *)CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0));
  }
  outpoint_00 = (OutPoint *)&stack0xfffffffffffff428;
  this_01 = local_578;
  create_sighash_func = in_RSI;
  std::
  function<cfd::core::ByteData256(cfd::TransactionContext_const*,cfd::core::OutPoint_const&,cfd::UtxoData_const&,cfd::core::SigHashType_const&,cfd::core::Pubkey_const&,cfd::core::Script_const&,cfd::core::WitnessVersion,cfd::core::ByteData_const*,cfd::core::TaprootScriptTree_const*)>
  ::
  function<cfd::core::ByteData256(&)(cfd::TransactionContext_const*,cfd::core::OutPoint_const&,cfd::UtxoData_const&,cfd::core::SigHashType_const&,cfd::core::Pubkey_const&,cfd::core::Script_const&,cfd::core::WitnessVersion,cfd::core::ByteData_const*,cfd::core::TaprootScriptTree_const*),void>
            (local_578,
             (_func_ByteData256_TransactionContext_ptr_OutPoint_ptr_UtxoData_ptr_SigHashType_ptr_Pubkey_ptr_Script_ptr_WitnessVersion_ByteData_ptr_TaprootScriptTree_ptr
              *)in_RSI);
  TransactionContextUtil::Verify<cfd::TransactionContext>
            (in_stack_00000010,in_stack_00000008,unaff_retaddr,txin_00,
             (function<cfd::core::ByteData256_(const_cfd::TransactionContext_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*)>
              *)create_sighash_func);
  std::
  function<cfd::core::ByteData256_(const_cfd::TransactionContext_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*)>
  ::~function((function<cfd::core::ByteData256_(const_cfd::TransactionContext_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*)>
               *)0x53bbdf);
  uVar1 = IsFindOutPoint(in_stack_fffffffffffff3d8,
                         (vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_> *)
                         in_stack_fffffffffffff3d0,outpoint_00);
  if (!(bool)uVar1) {
    std::vector<cfd::core::OutPoint,std::allocator<cfd::core::OutPoint>>::
    emplace_back<cfd::core::OutPoint_const&>
              ((vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_> *)this_01,in_RSI);
  }
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)this_01);
  UtxoData::~UtxoData((UtxoData *)CONCAT17(uVar1,in_stack_fffffffffffff3b0));
  return;
}

Assistant:

void TransactionContext::Verify(const OutPoint& outpoint) {
  UtxoData utxo;
  if (!IsFindUtxoMap(outpoint, &utxo)) {
    throw CfdException(
        CfdError::kCfdIllegalStateError, "Utxo is not found. verify fail.");
  }
  const auto& txin = vin_[GetTxInIndex(outpoint)];

  std::vector<UtxoData> utxo_list;
  utxo.locking_script = GetLockingScriptFromUtxoData(utxo);
  if (utxo.locking_script.IsTaprootScript()) {
    UtxoData work_utxo;
    for (const auto& txin_ref : vin_) {
      OutPoint target_outpoint(txin_ref.GetTxid(), txin_ref.GetVout());
      if (!IsFindUtxoMap(target_outpoint, &work_utxo)) {
        throw CfdException(
            CfdError::kCfdIllegalStateError,
            "Utxo is not found. Verify fail.");
      }
      work_utxo.locking_script = GetLockingScriptFromUtxoData(work_utxo);
      utxo_list.emplace_back(work_utxo);
    }
  }
  TransactionContextUtil::Verify<TransactionContext>(
      this, outpoint, utxo, &txin, CreateTxSighash);
  if (!IsFindOutPoint(verify_map_, outpoint)) {
    verify_map_.emplace_back(outpoint);
  }
}